

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

void __thiscall glu::ES2ContextInfo::ES2ContextInfo(ES2ContextInfo *this,RenderContext *context)

{
  ContextInfo::ContextInfo(&this->super_ContextInfo,context);
  (this->super_ContextInfo)._vptr_ContextInfo = (_func_int **)&PTR__ContextInfo_007853a0;
  (this->m_vertexUniformLoopsSupported).m_compute.m_vertexSource =
       "attribute highp vec4\ta_position;\nuniform int\t\t\tu_numIters;\nvoid main (void) {\n\tgl_Position = a_position;\n\tfor (int i = 0; i < u_numIters; i++)\n\t\tgl_Position += vec4(0.1);\n}\n"
  ;
  (this->m_vertexUniformLoopsSupported).m_compute.m_fragmentSource =
       "void main (void) {\n\tgl_FragColor = vec4(1.0);\n}\n";
  (this->m_vertexUniformLoopsSupported).m_value = false;
  (this->m_vertexUniformLoopsSupported).m_isComputed = false;
  (this->m_vertexDynamicLoopsSupported).m_compute.m_vertexSource =
       "attribute highp vec4\ta_position;\nuniform mediump float\ta, b;\nvoid main (void) {\n\tgl_Position = a_position;\n\tint numIters = a < b ? int(3.0*b) : int(a_position.x);\n\tfor (int i = 0; i < numIters; i++)\n\t\tgl_Position += vec4(0.1);\n}\n"
  ;
  (this->m_vertexDynamicLoopsSupported).m_compute.m_fragmentSource =
       "void main (void) {\n\tgl_FragColor = vec4(1.0);\n}\n";
  (this->m_vertexDynamicLoopsSupported).m_value = false;
  (this->m_vertexDynamicLoopsSupported).m_isComputed = false;
  (this->m_fragmentHighPrecisionSupported).m_compute.m_vertexSource =
       "attribute highp vec4 a_position;\nvoid main (void) {\n\tgl_Position = a_position;\n}\n";
  (this->m_fragmentHighPrecisionSupported).m_compute.m_fragmentSource =
       "varying highp vec4\t\tv_color;\nvoid main (void) {\n\thighp float tmp = v_color.r;\n\tgl_FragColor = v_color;\n}\n"
  ;
  (this->m_fragmentHighPrecisionSupported).m_value = false;
  (this->m_fragmentHighPrecisionSupported).m_isComputed = false;
  (this->m_fragmentUniformLoopsSupported).m_compute.m_vertexSource =
       "attribute highp vec4 a_position;\nvoid main (void) {\n\tgl_Position = a_position;\n}\n";
  (this->m_fragmentUniformLoopsSupported).m_compute.m_fragmentSource =
       "varying mediump vec4\tv_color;\nuniform int\t\t\tu_numIters;\nvoid main (void) {\n\tgl_FragColor = v_color;\n\tfor (int i = 0; i < u_numIters; i++)\n\t\tgl_FragColor += vec4(0.1);\n}\n"
  ;
  (this->m_fragmentUniformLoopsSupported).m_value = false;
  (this->m_fragmentUniformLoopsSupported).m_isComputed = false;
  (this->m_fragmentDynamicLoopsSupported).m_compute.m_vertexSource =
       "attribute highp vec4 a_position;\nvoid main (void) {\n\tgl_Position = a_position;\n}\n";
  (this->m_fragmentDynamicLoopsSupported).m_compute.m_fragmentSource =
       "varying mediump vec4\tv_color;\nuniform mediump float\ta, b;\nvoid main (void) {\n\tgl_FragColor = v_color;\n\tint numIters = a < b ? int(3.0*b) : int(v_color.x);\n\tfor (int i = 0; i < numIters; i++)\n\t\tgl_FragColor += vec4(0.1);\n}\n"
  ;
  (this->m_fragmentDynamicLoopsSupported).m_value = false;
  (this->m_fragmentDynamicLoopsSupported).m_isComputed = false;
  return;
}

Assistant:

ES2ContextInfo::ES2ContextInfo (const RenderContext& context)
	: glu::ContextInfo					(context)
	, m_vertexUniformLoopsSupported		(TryCompileProgram(s_vertexUniformLoopsSupported, s_defaultFragmentShader))
	, m_vertexDynamicLoopsSupported		(TryCompileProgram(s_vertexDynamicLoopsSupported, s_defaultFragmentShader))
	, m_fragmentHighPrecisionSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentHighPrecisionSupported))
	, m_fragmentUniformLoopsSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentUniformLoopsSupported))
	, m_fragmentDynamicLoopsSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentDynamicLoopsSupported))
{
}